

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp_obj.c
# Opt level: O1

rk_s32 kmpp_obj_get_shm_obj(KmppObj obj,char *name,KmppObj *val)

{
  rk_s32 rVar1;
  KmppShmPtr sptr;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 uVar2;
  anon_union_8_2_f7e366f2_for_KmppShmPtr_t_0 local_38;
  undefined8 uStack_30;
  
  uVar2 = (undefined4)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  if ((name == (char *)0x0 || obj == (KmppObj)0x0) || val == (KmppObj *)0x0) {
    _mpp_log_l(2,"kmpp_obj","obj %p get shm obj %s to %p failed invalid param\n",
               "kmpp_obj_get_shm_obj",obj,name,val);
    rVar1 = -1;
  }
  else {
    local_38.uaddr = 0;
    uStack_30 = 0;
    *val = (KmppObj)0x0;
    rVar1 = kmpp_obj_get_shm(obj,name,(KmppShmPtr *)&local_38);
    if ((rVar1 == 0) && (local_38.uaddr != 0)) {
      rVar1 = kmpp_obj_get_by_sptr(val,(KmppShmPtr *)&local_38,"kmpp_obj_get_shm_obj");
    }
    else {
      _mpp_log_l(2,"kmpp_obj","obj %p get shm %s failed ret %d\n","kmpp_obj_get_shm_obj",obj,name,
                 CONCAT44(uVar2,rVar1));
    }
  }
  return rVar1;
}

Assistant:

rk_s32 kmpp_obj_get_shm_obj(KmppObj obj, const char *name, KmppObj *val)
{
    rk_s32 ret = rk_nok;

    if (!obj || !name || !val) {
        mpp_loge_f("obj %p get shm obj %s to %p failed invalid param\n",
                   obj, name, val);
    } else {
        KmppObjImpl *impl = (KmppObjImpl *)obj;
        KmppShmPtr sptr = {0};

        *val = NULL;

        ret = kmpp_obj_get_shm(obj, name, &sptr);
        if (ret || !sptr.uptr) {
            mpp_loge_f("obj %p get shm %s failed ret %d\n", impl, name, ret);
        } else {
            ret = kmpp_obj_get_by_sptr(val, &sptr, __FUNCTION__);
        }
    }

    return ret;
}